

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask6_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = in[5];
  uVar2 = in[7];
  *out = uVar1 << 0x1e | in[4] << 0x18 | in[3] << 0x12 | in[2] << 0xc | in[1] << 6 | *in;
  out[1] = uVar2 << 10 | in[6] << 4 | uVar1 >> 2;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask6_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;

  return out + 1;
}